

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

smap * units::loadDefinedMeasurementTypes_abi_cxx11_(void)

{
  const_iterator pvVar1;
  unordered_map<std::__cxx11::string,units::precise_unit,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,units::precise_unit>>>
  *in_RDI;
  value_type *pr;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::pair<const_char_*,_units::precise_unit>,_251UL> *__range1;
  smap *knownMeasurementTypes;
  
  memset(in_RDI,0,0x38);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
                   *)in_RDI);
  __end1 = std::array<std::pair<const_char_*,_units::precise_unit>,_251UL>::begin
                     ((array<std::pair<const_char_*,_units::precise_unit>,_251UL> *)
                      defined_measurement_types);
  pvVar1 = std::array<std::pair<const_char_*,_units::precise_unit>,_251UL>::end
                     ((array<std::pair<const_char_*,_units::precise_unit>,_251UL> *)
                      defined_measurement_types);
  for (; __end1 != pvVar1; __end1 = __end1 + 1) {
    if (__end1->first != (char *)0x0) {
      std::
      unordered_map<std::__cxx11::string,units::precise_unit,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,units::precise_unit>>>
      ::emplace<char_const*const&,units::precise_unit_const&>(in_RDI,&__end1->first,&__end1->second)
      ;
    }
  }
  return (smap *)in_RDI;
}

Assistant:

static smap loadDefinedMeasurementTypes()
{
    smap knownMeasurementTypes{};
    for (const auto& pr : defined_measurement_types) {
        if (pr.first != nullptr) {
            knownMeasurementTypes.emplace(pr.first, pr.second);
        }
    }
    return knownMeasurementTypes;
}